

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcCrewResource::IfcCrewResource(IfcCrewResource *this)

{
  IfcCrewResource *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcConstructionResource).field_0x188,"IfcCrewResource");
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00f8b4b8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCrewResource,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCrewResource,_0UL> *)
             &(this->super_IfcConstructionResource).field_0x178,
             &PTR_construction_vtable_24__00f8b5a8);
  *(undefined8 *)&this->super_IfcConstructionResource = 0xf8b3b0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x188 = 0xf8b4a0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0xf8b3d8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0xf8b400;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0xf8b428;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0xf8b450;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0xf8b478;
  return;
}

Assistant:

IfcCrewResource() : Object("IfcCrewResource") {}